

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpropertyanimation.cpp
# Opt level: O1

void __thiscall QPropertyAnimation::setTargetObject(QPropertyAnimation *this,QObject *target)

{
  QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
  *data;
  QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
  *this_00;
  QPropertyAnimationPrivate *this_01;
  QBindingStatus *pQVar1;
  QObject *sender;
  QSlotObjectBase *slotObjRaw;
  long in_FS_OFFSET;
  QObject local_50;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QPropertyAnimationPrivate **)(this + 8);
  data = &(this_01->super_QVariantAnimationPrivate).super_QAbstractAnimationPrivate.state;
  pQVar1 = (this_01->super_QVariantAnimationPrivate).super_QAbstractAnimationPrivate.
           super_QObjectPrivate.super_QObjectData.bindingStorage.bindingStatus;
  if ((pQVar1 != (QBindingStatus *)0x0) &&
     (pQVar1->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
    QBindingStorage::registerDependency_helper
              (&(this_01->super_QVariantAnimationPrivate).super_QAbstractAnimationPrivate.
                super_QObjectPrivate.super_QObjectData.bindingStorage,(QUntypedPropertyData *)data);
  }
  if ((data->super_QPropertyData<QAbstractAnimation::State>).val == Stopped) {
    this_00 = &this_01->targetObject;
    QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
    ::removeBindingUnlessInWrapper(this_00);
    sender = (this_01->targetObject).super_QPropertyData<QObject_*>.val;
    if (sender != target) {
      if (sender != (QObject *)0x0) {
        local_50.d_ptr.d = (QObjectData *)QObject::destroyed;
        local_40 = 0;
        QObject::disconnectImpl
                  (sender,&local_50.d_ptr.d,(QObject *)this,(void **)0x0,&QObject::staticMetaObject)
        ;
      }
      (this_00->super_QPropertyData<QObject_*>).val = target;
      if (target != (QObject *)0x0) {
        local_50.d_ptr.d = (QObjectData *)QObject::destroyed;
        local_40 = 0;
        slotObjRaw = (QSlotObjectBase *)operator_new(0x18);
        (slotObjRaw->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i = 1;
        slotObjRaw->m_impl =
             QtPrivate::
             QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/animation/qpropertyanimation.cpp:180:26),_QtPrivate::List<>,_void>
             ::impl;
        *(QPropertyAnimationPrivate **)(slotObjRaw + 1) = this_01;
        QObject::connectImpl
                  (&local_50,target,&local_50.d_ptr.d,(QObject *)this,(void **)0x0,slotObjRaw,
                   AutoConnection,(int *)0x0,&QObject::staticMetaObject);
        QMetaObject::Connection::~Connection((Connection *)&local_50);
      }
      QPropertyAnimationPrivate::updateMetaProperty(this_01);
      QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
      ::notify(this_00);
    }
  }
  else {
    setTargetObject();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPropertyAnimation::setTargetObject(QObject *target)
{
    Q_D(QPropertyAnimation);
    if (d->state != QAbstractAnimation::Stopped) {
        qWarning("QPropertyAnimation::setTargetObject: you can't change the target of a running animation");
        return;
    }

    d->targetObject.removeBindingUnlessInWrapper();
    const QObject *oldTarget = d->targetObject.valueBypassingBindings();
    if (oldTarget == target)
        return;

    if (oldTarget != nullptr)
        QObject::disconnect(oldTarget, &QObject::destroyed, this, nullptr);
    d->targetObject.setValueBypassingBindings(target);

    if (target != nullptr) {
        QObject::connect(target, &QObject::destroyed, this,
                         [d] { d->targetObjectDestroyed(); });
    }
    d->updateMetaProperty();
    d->targetObject.notify();
}